

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O2

void do_pload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *pCVar3;
  DESCRIPTOR_DATA *d;
  char *pcVar4;
  FILE *pFVar5;
  char cVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  int returnCode;
  string buffer;
  string local_1298;
  char *local_1278 [2];
  char *local_1268;
  char *local_1258;
  char *local_1248;
  char name [4608];
  
  pcVar2 = one_argument(argument,name);
  if ((name[0] == '\0') || (*pcVar2 == '\0')) {
    pcVar2 = "Syntax: pload <char> <command>\n\r";
  }
  else {
    cVar6 = name[0] + -0x20;
    if (0x19 < (byte)(name[0] + 0x9fU)) {
      cVar6 = name[0];
    }
    name[0] = cVar6;
    pCVar3 = get_char_world(ch,name);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      d = new_descriptor();
      bVar1 = load_char_obj(d,name);
      if (bVar1) {
        local_1278[0] = "../player";
        local_1258 = ".plr";
        local_1248 = "../player";
        fmt_00.size_ = 0xcccc;
        fmt_00.data_ = (char *)0x15;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_1278;
        local_1268 = name;
        ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"cp {}{}{} {}pload.txt",fmt_00,args);
        returnCode = system(buffer._M_dataplus._M_p);
        if (returnCode != 0) {
          local_1278[0] = buffer._M_dataplus._M_p;
          fmt._M_str = "Command [{}] failed with exit code [{}]";
          fmt._M_len = 0x27;
          CLogger::Warn<char*,int&>((CLogger *)&RS.field_0x140,fmt,local_1278,&returnCode);
        }
        pCVar3 = d->character;
        pCVar3->desc = (DESCRIPTOR_DATA *)0x0;
        pCVar3->next = char_list;
        char_list = pCVar3;
        d->outsize = 2000;
        pcVar4 = (char *)operator_new__(2000);
        d->outbuf = pcVar4;
        d->connected = 0;
        reset_char(pCVar3);
        pCVar3 = d->character;
        pcVar4 = palloc_string("PLOAD");
        d->character->pcdata->host = pcVar4;
        interpret(ch,pcVar2);
        local_1278[0] = "../player";
        local_1258 = ".plr";
        fmt_01.size_ = 0xccc;
        fmt_01.data_ = (char *)0x7;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_1278;
        local_1268 = name;
        ::fmt::v9::vformat_abi_cxx11_(&local_1298,(v9 *)"{}/{}{}",fmt_01,args_00);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&local_1298);
        std::__cxx11::string::~string((string *)&local_1298);
        pFVar5 = fopen(buffer._M_dataplus._M_p,"r");
        if (pFVar5 != (FILE *)0x0) {
          save_char_obj(pCVar3);
          extract_char(pCVar3,true);
        }
        free_descriptor(d);
        std::__cxx11::string::~string((string *)&buffer);
        return;
      }
      pcVar2 = "No such character exists.\n\r";
    }
    else {
      pcVar2 = "That character is already online!\n\r";
    }
  }
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_pload(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char name[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, name);

	if (name[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Syntax: pload <char> <command>\n\r", ch);
		return;
	}

	name[0] = UPPER(name[0]);

	if (get_char_world(ch, name) != nullptr)
	{
		send_to_char("That character is already online!\n\r", ch);
		return;
	}

	d = new_descriptor();

	if (!load_char_obj(d, name))
	{
		send_to_char("No such character exists.\n\r", ch);
		return;
	}

	auto buffer = fmt::format("cp {}{}{} {}pload.txt", RIFT_PLAYER_DIR, name, ".plr", RIFT_PLAYER_DIR);

	auto returnCode = system(buffer.c_str());
	if(returnCode != 0) // cp returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
		RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);

	d->character->desc = nullptr;
	d->character->next = char_list;

	char_list = d->character;

	d->outsize = 2000;
	d->outbuf = new char[d->outsize];
	d->connected = CON_PLAYING;

	reset_char(d->character);

	victim = d->character;

	d->character->pcdata->host = palloc_string("PLOAD");

	interpret(ch, argument);

	buffer = fmt::format("{}/{}{}", RIFT_PLAYER_DIR, name, ".plr");

	if (fopen(buffer.c_str(), "r") != nullptr)
	{
		save_char_obj(victim);
		extract_char(victim, true);
	}

	free_descriptor(d);
}